

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::ProcessEdgesAtTopOfScanbeam(Clipper *this,cInt topY)

{
  size_t *psVar1;
  double dVar2;
  long lVar3;
  IntPoint OffPt;
  TEdge *pt_00;
  TEdge *pTVar4;
  _List_node_base *p_Var5;
  long lVar6;
  OutPt *pOVar7;
  OutPt *op2;
  TEdge *pTVar8;
  bool bVar9;
  IntPoint pt3;
  IntPoint pt3_00;
  IntPoint pt;
  TEdge *local_50;
  IntPoint local_48;
  OutPt *local_38;
  
  pTVar8 = *(TEdge **)
            (this->_vptr_Clipper[-3] + 0x10 +
            (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
  local_50 = pTVar8;
  if (pTVar8 != (TEdge *)0x0) {
    do {
      if ((pTVar8->Top).Y == topY) {
        bVar9 = pTVar8->NextInLML == (TEdge *)0x0;
      }
      else {
        bVar9 = false;
      }
      local_50 = pTVar8;
      if (bVar9) {
        pTVar4 = GetMaximaPairEx(pTVar8);
        if (pTVar4 != (TEdge *)0x0) {
          bVar9 = pTVar4->Dx != -1e+40;
          goto LAB_002dacde;
        }
LAB_002dace2:
        if (this->m_StrictSimple == true) {
          p_Var5 = (_List_node_base *)operator_new(0x18);
          p_Var5[1]._M_next = (_List_node_base *)(pTVar8->Top).X;
          std::__detail::_List_node_base::_M_hook(p_Var5);
          psVar1 = &(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>._M_impl
                    ._M_node._M_size;
          *psVar1 = *psVar1 + 1;
        }
        pTVar4 = pTVar8->PrevInAEL;
        DoMaxima(this,pTVar8);
        local_50 = pTVar4;
        if (pTVar4 == (TEdge *)0x0) {
          local_50 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
        }
      }
      else {
LAB_002dacde:
        if (bVar9) goto LAB_002dace2;
        lVar6 = (pTVar8->Top).Y;
        if (lVar6 == topY) {
          if (((pTVar8->NextInLML == (TEdge *)0x0) ||
              (dVar2 = pTVar8->NextInLML->Dx, dVar2 != -1e+40)) || (NAN(dVar2))) {
            if (lVar6 != topY) goto LAB_002dadba;
            lVar6 = (pTVar8->Top).X;
            goto LAB_002dadea;
          }
          ClipperBase::UpdateEdgeIntoAEL
                    ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                     &local_50);
          pTVar8 = local_50;
          if (-1 < local_50->OutIdx) {
            AddOutPt(this,local_50,&local_50->Bot);
          }
          pTVar4 = this->m_SortedEdges;
          if (pTVar4 == (TEdge *)0x0) {
            this->m_SortedEdges = pTVar8;
            pTVar8->NextInSEL = (TEdge *)0x0;
            pTVar8->PrevInSEL = (TEdge *)0x0;
          }
          else {
            pTVar8->NextInSEL = pTVar4;
            pTVar8->PrevInSEL = (TEdge *)0x0;
            pTVar4->PrevInSEL = pTVar8;
            this->m_SortedEdges = pTVar8;
          }
        }
        else {
LAB_002dadba:
          dVar2 = (double)(topY - (pTVar8->Bot).Y) * pTVar8->Dx;
          lVar6 = (long)(dVar2 + *(double *)(&DAT_00303f20 + (ulong)(dVar2 < 0.0) * 8)) +
                  (pTVar8->Bot).X;
LAB_002dadea:
          (pTVar8->Curr).X = lVar6;
          (pTVar8->Curr).Y = topY;
        }
        pTVar8 = local_50;
        if ((((this->m_StrictSimple == true) && (-1 < local_50->OutIdx)) &&
            ((pTVar4 = local_50->PrevInAEL, pTVar4 != (TEdge *)0x0 && local_50->WindDelta != 0 &&
             ((-1 < pTVar4->OutIdx && ((pTVar4->Curr).X == (local_50->Curr).X)))))) &&
           (pTVar4->WindDelta != 0)) {
          local_48.X = (local_50->Curr).X;
          local_48.Y = (local_50->Curr).Y;
          local_38 = AddOutPt(this,pTVar4,&local_48);
          pOVar7 = AddOutPt(this,pTVar8,&local_48);
          OffPt.Y = local_48.Y;
          OffPt.X = local_48.X;
          AddJoin(this,local_38,pOVar7,OffPt);
        }
      }
      pTVar8 = local_50->NextInAEL;
    } while (pTVar8 != (TEdge *)0x0);
    local_50 = (TEdge *)0x0;
  }
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::sort(&this->m_Maxima);
  ProcessHorizontals(this);
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::clear(&this->m_Maxima);
  for (local_50 = *(TEdge **)
                   (this->_vptr_Clipper[-3] + 0x10 +
                   (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
      local_50 != (TEdge *)0x0; local_50 = local_50->NextInAEL) {
    if (((local_50->Top).Y == topY) && (local_50->NextInLML != (TEdge *)0x0)) {
      if (local_50->OutIdx < 0) {
        pOVar7 = (OutPt *)0x0;
      }
      else {
        pOVar7 = AddOutPt(this,local_50,&local_50->Top);
      }
      ClipperBase::UpdateEdgeIntoAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                 &local_50);
      pt_00 = local_50;
      pTVar8 = local_50->NextInAEL;
      pTVar4 = local_50->PrevInAEL;
      if ((((((pTVar4 != (TEdge *)0x0) && (lVar6 = (pTVar4->Curr).X, lVar6 == (local_50->Bot).X)) &&
            (pOVar7 != (OutPt *)0x0)) &&
           ((lVar3 = (pTVar4->Curr).Y, lVar3 == (local_50->Bot).Y && (-1 < pTVar4->OutIdx)))) &&
          ((((pTVar4->Top).Y < lVar3 &&
            ((pt3.Y = lVar3, pt3.X = lVar6,
             bVar9 = SlopesEqual(local_50->Curr,local_50->Top,pt3,pTVar4->Top,
                                 (bool)(this->_vptr_Clipper[-3] + 8)
                                       [(long)&(this->m_GhostJoins).
                                               super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                       ]), bVar9 && (pt_00->WindDelta != 0)))) &&
           (pTVar4->WindDelta != 0)))) ||
         (((((pTVar8 != (TEdge *)0x0 && (lVar6 = (pTVar8->Curr).X, lVar6 == (pt_00->Bot).X)) &&
            (pOVar7 != (OutPt *)0x0)) &&
           (((lVar3 = (pTVar8->Curr).Y, lVar3 == (pt_00->Bot).Y && (-1 < pTVar8->OutIdx)) &&
            (((pTVar8->Top).Y < lVar3 &&
             ((pt3_00.Y = lVar3, pt3_00.X = lVar6,
              bVar9 = SlopesEqual(pt_00->Curr,pt_00->Top,pt3_00,pTVar8->Top,
                                  (bool)(this->_vptr_Clipper[-3] + 8)
                                        [(long)&(this->m_GhostJoins).
                                                super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                        ]), bVar9 && (pt_00->WindDelta != 0)))))))) &&
          (pTVar4 = pTVar8, pTVar8->WindDelta != 0)))) {
        op2 = AddOutPt(this,pTVar4,&pt_00->Bot);
        AddJoin(this,pOVar7,op2,pt_00->Top);
      }
    }
  }
  return;
}

Assistant:

void Clipper::ProcessEdgesAtTopOfScanbeam(const cInt topY)
{
  TEdge* e = m_ActiveEdges;
  while( e )
  {
    //1. process maxima, treating them as if they're 'bent' horizontal edges,
    //   but exclude maxima with horizontal edges. nb: e can't be a horizontal.
    bool IsMaximaEdge = IsMaxima(e, topY);

    if(IsMaximaEdge)
    {
      TEdge* eMaxPair = GetMaximaPairEx(e);
      IsMaximaEdge = (!eMaxPair || !IsHorizontal(*eMaxPair));
    }

    if(IsMaximaEdge)
    {
      if (m_StrictSimple) m_Maxima.push_back(e->Top.X);
      TEdge* ePrev = e->PrevInAEL;
      DoMaxima(e);
      if( !ePrev ) e = m_ActiveEdges;
      else e = ePrev->NextInAEL;
    }
    else
    {
      //2. promote horizontal edges, otherwise update Curr.X and Curr.Y ...
      if (IsIntermediate(e, topY) && IsHorizontal(*e->NextInLML))
      {
        UpdateEdgeIntoAEL(e);
        if (e->OutIdx >= 0)
          AddOutPt(e, e->Bot);
        AddEdgeToSEL(e);
      } 
      else
      {
        e->Curr.X = TopX( *e, topY );
        e->Curr.Y = topY;
#ifdef use_xyz
		e->Curr.Z = topY == e->Top.Y ? e->Top.Z : (topY == e->Bot.Y ? e->Bot.Z : 0);
#endif
	  }

      //When StrictlySimple and 'e' is being touched by another edge, then
      //make sure both edges have a vertex here ...
      if (m_StrictSimple)
      {  
        TEdge* ePrev = e->PrevInAEL;
        if ((e->OutIdx >= 0) && (e->WindDelta != 0) && ePrev && (ePrev->OutIdx >= 0) &&
          (ePrev->Curr.X == e->Curr.X) && (ePrev->WindDelta != 0))
        {
          IntPoint pt = e->Curr;
#ifdef use_xyz
          SetZ(pt, *ePrev, *e);
#endif
          OutPt* op = AddOutPt(ePrev, pt);
          OutPt* op2 = AddOutPt(e, pt);
          AddJoin(op, op2, pt); //StrictlySimple (type-3) join
        }
      }

      e = e->NextInAEL;
    }
  }

  //3. Process horizontals at the Top of the scanbeam ...
  m_Maxima.sort();
  ProcessHorizontals();
  m_Maxima.clear();

  //4. Promote intermediate vertices ...
  e = m_ActiveEdges;
  while(e)
  {
    if(IsIntermediate(e, topY))
    {
      OutPt* op = 0;
      if( e->OutIdx >= 0 ) 
        op = AddOutPt(e, e->Top);
      UpdateEdgeIntoAEL(e);

      //if output polygons share an edge, they'll need joining later ...
      TEdge* ePrev = e->PrevInAEL;
      TEdge* eNext = e->NextInAEL;
      if (ePrev && ePrev->Curr.X == e->Bot.X &&
        ePrev->Curr.Y == e->Bot.Y && op &&
        ePrev->OutIdx >= 0 && ePrev->Curr.Y > ePrev->Top.Y &&
        SlopesEqual(e->Curr, e->Top, ePrev->Curr, ePrev->Top, m_UseFullRange) &&
        (e->WindDelta != 0) && (ePrev->WindDelta != 0))
      {
        OutPt* op2 = AddOutPt(ePrev, e->Bot);
        AddJoin(op, op2, e->Top);
      }
      else if (eNext && eNext->Curr.X == e->Bot.X &&
        eNext->Curr.Y == e->Bot.Y && op &&
        eNext->OutIdx >= 0 && eNext->Curr.Y > eNext->Top.Y &&
        SlopesEqual(e->Curr, e->Top, eNext->Curr, eNext->Top, m_UseFullRange) &&
        (e->WindDelta != 0) && (eNext->WindDelta != 0))
      {
        OutPt* op2 = AddOutPt(eNext, e->Bot);
        AddJoin(op, op2, e->Top);
      }
    }
    e = e->NextInAEL;
  }
}